

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
tf::SmallVectorImpl<tf::Semaphore_*>::~SmallVectorImpl(SmallVectorImpl<tf::Semaphore_*> *this)

{
  bool bVar1;
  iterator ppSVar2;
  iterator ppSVar3;
  SmallVectorTemplateCommon<tf::Semaphore_*,_void> *in_RDI;
  
  ppSVar2 = SmallVectorTemplateCommon<tf::Semaphore_*,_void>::begin(in_RDI);
  ppSVar3 = SmallVectorTemplateCommon<tf::Semaphore_*,_void>::end(in_RDI);
  SmallVectorTemplateBase<tf::Semaphore_*,_true>::destroy_range(ppSVar2,ppSVar3);
  bVar1 = SmallVectorTemplateCommon<tf::Semaphore_*,_void>::isSmall(in_RDI);
  if (!bVar1) {
    ppSVar2 = SmallVectorTemplateCommon<tf::Semaphore_*,_void>::begin(in_RDI);
    free(ppSVar2);
  }
  return;
}

Assistant:

~SmallVectorImpl() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());

    // If this wasn't grown from the inline copy, deallocate the old space.
    if (!this->isSmall())
      std::free(this->begin());
  }